

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

char * Diligent::GetShaderCompilerTypeString(SHADER_COMPILER Compiler)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  SHADER_COMPILER Compiler_local;
  
  switch(Compiler) {
  case SHADER_COMPILER_DEFAULT:
    pcStack_10 = "Default";
    break;
  case SHADER_COMPILER_GLSLANG:
    pcStack_10 = "glslang";
    break;
  case SHADER_COMPILER_DXC:
    pcStack_10 = "DXC";
    break;
  case SHADER_COMPILER_FXC:
    pcStack_10 = "FXC";
    break;
  default:
    msg.field_2._12_4_ = Compiler;
    FormatString<char[27]>((string *)local_38,(char (*) [27])"Unexpected shader compiler");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetShaderCompilerTypeString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x5fd);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const char* GetShaderCompilerTypeString(SHADER_COMPILER Compiler)
{
    static_assert(SHADER_COMPILER_LAST == 3, "Please update this function to handle the new shader compiler");
    switch (Compiler)
    {
        // clang-format off
        case SHADER_COMPILER_DEFAULT: return "Default";
        case SHADER_COMPILER_GLSLANG: return "glslang";
        case SHADER_COMPILER_DXC:     return "DXC";
        case SHADER_COMPILER_FXC:     return "FXC";
        // clang-format on
        default:
            UNEXPECTED("Unexpected shader compiler");
            return "UNKNOWN";
    }
}